

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn_arm.c
# Opt level: O0

uc_err reg_write_arm(void *_env,int mode,uint regid,void *value,size_t *size,int *setpc)

{
  uint uVar1;
  int iVar2;
  ulong *puVar3;
  ulong local_60;
  uint64_t in_value;
  uint64_t *p_reg_value;
  uint32_t reg_index_2;
  uint32_t reg_index_1;
  uint32_t reg_index;
  uc_err ret;
  CPUARMState *env;
  int *setpc_local;
  size_t *size_local;
  void *value_local;
  uint regid_local;
  int mode_local;
  void *_env_local;
  
  reg_index_1 = 0xf;
  if ((regid < 0x42) || (0x4e < regid)) {
    if ((regid < 0x32) || (0x41 < regid)) {
      if ((regid < 0xe) || (0x2d < regid)) {
        if ((regid < 0x4f) || (0x6e < regid)) {
          switch(regid) {
          case 1:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            iVar2 = arm_feature((CPUARMState *)_env,9);
            if (iVar2 == 0) {
              cpsr_write_arm((CPUARMState *)_env,*value,0xf80f0000,CPSRWriteByUnicorn);
              arm_rebuild_hflags_arm((CPUARMState *)_env);
            }
            else {
              v7m_msr_xpsr((CPUARMState *)_env,8,0,*value);
            }
            break;
          case 2:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            cpsr_write_arm((CPUARMState *)_env,*value,0xf0000000,CPSRWriteByUnicorn);
            arm_rebuild_hflags_arm((CPUARMState *)_env);
            break;
          case 3:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            cpsr_write_arm((CPUARMState *)_env,*value,0xffffffff,CPSRWriteByUnicorn);
            arm_rebuild_hflags_arm((CPUARMState *)_env);
            break;
          case 4:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            *(undefined4 *)((long)_env + 0xe48) = *value;
            break;
          case 6:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            vfp_set_fpscr_arm((CPUARMState *)_env,*value);
            break;
          case 8:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            *(undefined4 *)((long)_env + 0xe28) = *value;
            break;
          case 10:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            *(undefined4 *)((long)_env + 0x38) = *value;
            break;
          case 0xb:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            *(ulong *)((long)_env + 0x140) = (ulong)(*value & 0xfffffffe);
            *(uint *)((long)_env + 0x220) = *value & 1;
            *(uint *)(*(long *)((long)_env + 0x1128) + 0x788) = *value & 1;
            *(uint *)((long)_env + 0x3c) = *value & 0xfffffffe;
            *setpc = 1;
            break;
          case 0xc:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            *(undefined4 *)((long)_env + 0x34) = *value;
            break;
          case 0xd:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            *(undefined4 *)((long)_env + 0x158) = *value;
            break;
          case 0x71:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            *(long *)((long)_env + 0x548) = (long)*value;
            break;
          case 0x72:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            v7m_msr_xpsr((CPUARMState *)_env,8,5,*value);
            break;
          case 0x73:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            helper_v7m_msr_arm((CPUARMState *)_env,8,*value);
            break;
          case 0x74:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            helper_v7m_msr_arm((CPUARMState *)_env,9,*value);
            break;
          case 0x75:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            helper_v7m_msr_arm((CPUARMState *)_env,0x14,*value);
            break;
          case 0x76:
          case 0x82:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            v7m_msr_xpsr((CPUARMState *)_env,8,1,*value);
            break;
          case 0x77:
          case 0x85:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            v7m_msr_xpsr((CPUARMState *)_env,8,2,*value);
            break;
          case 0x78:
          case 0x88:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            v7m_msr_xpsr((CPUARMState *)_env,8,3,*value);
            break;
          case 0x79:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            v7m_msr_xpsr((CPUARMState *)_env,8,6,*value);
            break;
          case 0x7a:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            v7m_msr_xpsr((CPUARMState *)_env,8,7,*value);
            break;
          case 0x7b:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            helper_v7m_msr_arm((CPUARMState *)_env,0x10,*value);
            break;
          case 0x7c:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            helper_v7m_msr_arm((CPUARMState *)_env,0x11,*value);
            break;
          case 0x7d:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            helper_v7m_msr_arm((CPUARMState *)_env,0x12,*value);
            break;
          case 0x7e:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            helper_v7m_msr_arm((CPUARMState *)_env,0x13,*value);
            break;
          case 0x7f:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            v7m_msr_xpsr((CPUARMState *)_env,8,0,*value);
            break;
          case 0x80:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            v7m_msr_xpsr((CPUARMState *)_env,4,0,*value);
            break;
          case 0x81:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            v7m_msr_xpsr((CPUARMState *)_env,0xc,0,*value);
            break;
          case 0x83:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            v7m_msr_xpsr((CPUARMState *)_env,4,1,*value);
            break;
          case 0x84:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            v7m_msr_xpsr((CPUARMState *)_env,0xc,1,*value);
            break;
          case 0x86:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            v7m_msr_xpsr((CPUARMState *)_env,4,2,*value);
            break;
          case 0x87:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            v7m_msr_xpsr((CPUARMState *)_env,0xc,2,*value);
            break;
          case 0x89:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            v7m_msr_xpsr((CPUARMState *)_env,4,3,*value);
            break;
          case 0x8a:
            if (*size < 4) {
              return UC_ERR_OVERFLOW;
            }
            *size = 4;
            reg_index_1 = 0;
            v7m_msr_xpsr((CPUARMState *)_env,0xc,3,*value);
            break;
          case 0x8b:
            if (*size < 0x28) {
              return UC_ERR_OVERFLOW;
            }
            *size = 0x28;
            reg_index_1 = write_cp_reg((CPUARMState *)_env,(uc_arm_cp_reg *)value);
            arm_rebuild_hflags_arm((CPUARMState *)_env);
          }
        }
        else {
          if (*size < 4) {
            return UC_ERR_OVERFLOW;
          }
          *size = 4;
          reg_index_1 = 0;
          uVar1 = regid - 0x4f;
          puVar3 = (ulong *)((long)_env +
                            (ulong)((uVar1 & 3) >> 1) * 8 + (ulong)(uVar1 >> 2) * 0x10 + 0xc10);
          if ((uVar1 & 1) == 0) {
            local_60 = *puVar3 & 0xffffffff00000000 | (ulong)*value;
          }
          else {
            local_60 = (ulong)*value << 0x20 | *puVar3 & 0xffffffff;
          }
          *puVar3 = local_60;
        }
      }
      else {
        if (*size < 8) {
          return UC_ERR_OVERFLOW;
        }
        *size = 8;
        reg_index_1 = 0;
        *(undefined8 *)
         ((long)_env + (ulong)(regid - 0xe & 1) * 8 + (ulong)(regid - 0xe >> 1) * 0x10 + 0xc10) =
             *value;
      }
    }
    else {
      if (*size < 0x10) {
        return UC_ERR_OVERFLOW;
      }
      *size = 0x10;
      reg_index_1 = 0;
      *(undefined8 *)((long)_env + (ulong)(regid - 0x32) * 0x10 + 0xc10) = *value;
      *(undefined8 *)((long)_env + (ulong)(regid - 0x32) * 0x10 + 0xc18) =
           *(undefined8 *)((long)value + 8);
    }
  }
  else {
    if (*size < 4) {
      return UC_ERR_OVERFLOW;
    }
    *size = 4;
    reg_index_1 = 0;
    *(undefined4 *)((long)_env + (ulong)(regid - 0x42) * 4) = *value;
  }
  return reg_index_1;
}

Assistant:

DEFAULT_VISIBILITY
uc_err reg_write(void *_env, int mode, unsigned int regid, const void *value,
                 size_t *size, int *setpc)
{
    CPUARMState *env = _env;
    uc_err ret = UC_ERR_ARG;

    if (regid >= UC_ARM_REG_R0 && regid <= UC_ARM_REG_R12) {
        CHECK_REG_TYPE(uint32_t);
        env->regs[regid - UC_ARM_REG_R0] = *(uint32_t *)value;
    } else if (regid >= UC_ARM_REG_Q0 && regid <= UC_ARM_REG_Q15) {
        CHECK_REG_TYPE(uint64_t[2]);
        uint32_t reg_index = regid - UC_ARM_REG_Q0;
        env->vfp.zregs[reg_index].d[0] = *(uint64_t *)value;
        env->vfp.zregs[reg_index].d[1] = *(((uint64_t *)value) + 1);
    } else if (regid >= UC_ARM_REG_D0 && regid <= UC_ARM_REG_D31) {
        CHECK_REG_TYPE(uint64_t);
        uint32_t reg_index = regid - UC_ARM_REG_D0;
        env->vfp.zregs[reg_index / 2].d[reg_index & 1] = *(uint64_t *)value;
    } else if (regid >= UC_ARM_REG_S0 && regid <= UC_ARM_REG_S31) {
        CHECK_REG_TYPE(uint32_t);
        uint32_t reg_index = regid - UC_ARM_REG_S0;
        uint64_t *p_reg_value =
            &env->vfp.zregs[reg_index / 4].d[reg_index % 4 / 2];
        uint64_t in_value = *((uint32_t *)value);
        if (reg_index % 2 == 0) {
            in_value |= *p_reg_value & 0xffffffff00000000ul;
        } else {
            in_value = (in_value << 32) | (*p_reg_value & 0xfffffffful);
        }

        *p_reg_value = in_value;
    } else {
        switch (regid) {
        case UC_ARM_REG_APSR:
            CHECK_REG_TYPE(uint32_t);
            if (!arm_feature(env, ARM_FEATURE_M)) {
                cpsr_write(env, *(uint32_t *)value,
                           (CPSR_NZCV | CPSR_Q | CPSR_GE), CPSRWriteByUnicorn);
                arm_rebuild_hflags(env);
            } else {
                // Same with UC_ARM_REG_APSR_NZCVQ
                v7m_msr_xpsr(env, 0b1000, 0, *(uint32_t *)value);
            }
            break;
        case UC_ARM_REG_APSR_NZCV:
            CHECK_REG_TYPE(uint32_t);
            cpsr_write(env, *(uint32_t *)value, CPSR_NZCV, CPSRWriteByUnicorn);
            arm_rebuild_hflags(env);
            break;
        case UC_ARM_REG_CPSR:
            CHECK_REG_TYPE(uint32_t);
            cpsr_write(env, *(uint32_t *)value, ~0, CPSRWriteByUnicorn);
            arm_rebuild_hflags(env);
            break;
        case UC_ARM_REG_SPSR:
            CHECK_REG_TYPE(uint32_t);
            env->spsr = *(uint32_t *)value;
            break;
        // case UC_ARM_REG_SP:
        case UC_ARM_REG_R13:
            CHECK_REG_TYPE(uint32_t);
            env->regs[13] = *(uint32_t *)value;
            break;
        // case UC_ARM_REG_LR:
        case UC_ARM_REG_R14:
            CHECK_REG_TYPE(uint32_t);
            env->regs[14] = *(uint32_t *)value;
            break;
        // case UC_ARM_REG_PC:
        case UC_ARM_REG_R15:
            CHECK_REG_TYPE(uint32_t);
            env->pc = (*(uint32_t *)value & ~1);
            env->thumb = (*(uint32_t *)value & 1);
            env->uc->thumb = (*(uint32_t *)value & 1);
            env->regs[15] = (*(uint32_t *)value & ~1);
            *setpc = 1;
            break;
            // case UC_ARM_REG_C1_C0_2:
            //     env->cp15.c1_coproc = *(int32_t *)value;
            //     break;

        case UC_ARM_REG_C13_C0_3:
            CHECK_REG_TYPE(int32_t);
            env->cp15.tpidrro_el[0] = *(int32_t *)value;
            break;
        case UC_ARM_REG_FPEXC:
            CHECK_REG_TYPE(int32_t);
            env->vfp.xregs[ARM_VFP_FPEXC] = *(int32_t *)value;
            break;
        case UC_ARM_REG_FPSCR:
            CHECK_REG_TYPE(int32_t);
            vfp_set_fpscr(env, *(int32_t *)value);
            break;
        case UC_ARM_REG_FPSID:
            CHECK_REG_TYPE(int32_t);
            env->vfp.xregs[ARM_VFP_FPSID] = *(int32_t *)value;
            break;
        case UC_ARM_REG_IPSR:
            CHECK_REG_TYPE(uint32_t);
            v7m_msr_xpsr(env, 0b1000, 5, *(uint32_t *)value);
            break;
        case UC_ARM_REG_MSP:
            CHECK_REG_TYPE(uint32_t);
            helper_v7m_msr(env, 8, *(uint32_t *)value);
            break;
        case UC_ARM_REG_PSP:
            CHECK_REG_TYPE(uint32_t);
            helper_v7m_msr(env, 9, *(uint32_t *)value);
            break;
        case UC_ARM_REG_CONTROL:
            CHECK_REG_TYPE(uint32_t);
            helper_v7m_msr(env, 20, *(uint32_t *)value);
            break;
        case UC_ARM_REG_EPSR:
            CHECK_REG_TYPE(uint32_t);
            v7m_msr_xpsr(env, 0b1000, 6, *(uint32_t *)value);
            break;
        case UC_ARM_REG_IEPSR:
            CHECK_REG_TYPE(uint32_t);
            v7m_msr_xpsr(env, 0b1000, 7, *(uint32_t *)value);
            break;
        case UC_ARM_REG_PRIMASK:
            CHECK_REG_TYPE(uint32_t);
            helper_v7m_msr(env, 16, *(uint32_t *)value);
            break;
        case UC_ARM_REG_BASEPRI:
            CHECK_REG_TYPE(uint32_t);
            helper_v7m_msr(env, 17, *(uint32_t *)value);
            break;
        case UC_ARM_REG_BASEPRI_MAX:
            CHECK_REG_TYPE(uint32_t);
            helper_v7m_msr(env, 18, *(uint32_t *)value);
            break;
        case UC_ARM_REG_FAULTMASK:
            CHECK_REG_TYPE(uint32_t);
            helper_v7m_msr(env, 19, *(uint32_t *)value);
            break;
        case UC_ARM_REG_APSR_NZCVQ:
            CHECK_REG_TYPE(uint32_t);
            v7m_msr_xpsr(env, 0b1000, 0, *(uint32_t *)value);
            break;
        case UC_ARM_REG_APSR_G:
            CHECK_REG_TYPE(uint32_t);
            v7m_msr_xpsr(env, 0b0100, 0, *(uint32_t *)value);
            break;
        case UC_ARM_REG_APSR_NZCVQG:
            CHECK_REG_TYPE(uint32_t);
            v7m_msr_xpsr(env, 0b1100, 0, *(uint32_t *)value);
            break;
        case UC_ARM_REG_IAPSR:
        case UC_ARM_REG_IAPSR_NZCVQ:
            CHECK_REG_TYPE(uint32_t);
            v7m_msr_xpsr(env, 0b1000, 1, *(uint32_t *)value);
            break;
        case UC_ARM_REG_IAPSR_G:
            CHECK_REG_TYPE(uint32_t);
            v7m_msr_xpsr(env, 0b0100, 1, *(uint32_t *)value);
            break;
        case UC_ARM_REG_IAPSR_NZCVQG:
            CHECK_REG_TYPE(uint32_t);
            v7m_msr_xpsr(env, 0b1100, 1, *(uint32_t *)value);
            break;
        case UC_ARM_REG_EAPSR:
        case UC_ARM_REG_EAPSR_NZCVQ:
            CHECK_REG_TYPE(uint32_t);
            v7m_msr_xpsr(env, 0b1000, 2, *(uint32_t *)value);
            break;
        case UC_ARM_REG_EAPSR_G:
            CHECK_REG_TYPE(uint32_t);
            v7m_msr_xpsr(env, 0b0100, 2, *(uint32_t *)value);
            break;
        case UC_ARM_REG_EAPSR_NZCVQG:
            CHECK_REG_TYPE(uint32_t);
            v7m_msr_xpsr(env, 0b1100, 2, *(uint32_t *)value);
            break;
        case UC_ARM_REG_XPSR:
        case UC_ARM_REG_XPSR_NZCVQ:
            CHECK_REG_TYPE(uint32_t);
            v7m_msr_xpsr(env, 0b1000, 3, *(uint32_t *)value);
            break;
        case UC_ARM_REG_XPSR_G:
            CHECK_REG_TYPE(uint32_t);
            v7m_msr_xpsr(env, 0b0100, 3, *(uint32_t *)value);
            break;
        case UC_ARM_REG_XPSR_NZCVQG:
            CHECK_REG_TYPE(uint32_t);
            v7m_msr_xpsr(env, 0b1100, 3, *(uint32_t *)value);
            break;
        case UC_ARM_REG_CP_REG:
            CHECK_REG_TYPE(uc_arm_cp_reg);
            ret = write_cp_reg(env, (uc_arm_cp_reg *)value);
            arm_rebuild_hflags_arm(env);
            break;
        }
    }

    return ret;
}